

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O3

void Llb_ManCutPrint(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  Vec_Ptr_t *__ptr;
  Vec_Ptr_t *vMinCut;
  int Counter;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  
  lVar8 = (long)vLower->nSize;
  uVar9 = 0;
  if (0 < lVar8) {
    lVar4 = 0;
    do {
      lVar4 = lVar4 + 1;
    } while (lVar8 != lVar4);
    lVar4 = 0;
    do {
      lVar4 = lVar4 + 1;
    } while (lVar8 != lVar4);
  }
  printf("Leaf: %3d=%3d+%3d+%3d  ");
  if (0 < (long)vUpper->nSize) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      if (((*(uint *)((long)vUpper->pArray[lVar8] + 0x18) & 7) == 2) &&
         (*vUpper->pArray[lVar8] < p->nTruePis)) {
        uVar9 = uVar9 + 1;
      }
      lVar8 = lVar8 + 1;
    } while (vUpper->nSize != lVar8);
  }
  uVar2 = Llb_ManCutLiNum(p,vUpper);
  uVar7 = 0;
  printf("Root: %3d=%3d+%3d+%3d  ",(ulong)(uint)vUpper->nSize,(ulong)uVar9,(ulong)uVar2,
         (ulong)((vUpper->nSize - uVar2) - uVar9));
  __ptr = Llb_ManCutSupp(p,vLower,vUpper);
  uVar9 = __ptr->nSize;
  lVar8 = (long)(int)uVar9;
  uVar6 = 0;
  uVar5 = 0;
  if (0 < lVar8) {
    lVar4 = 0;
    uVar6 = 0;
    do {
      piVar1 = (int *)__ptr->pArray[lVar4];
      if (((piVar1[6] & 7U) == 2) && (*piVar1 < p->nTruePis)) {
        uVar6 = (ulong)((int)uVar6 + 1);
      }
      lVar4 = lVar4 + 1;
    } while (lVar8 != lVar4);
    lVar4 = 0;
    uVar5 = 0;
    do {
      piVar1 = (int *)__ptr->pArray[lVar4];
      if (((piVar1[6] & 7U) == 2) && (p->nTruePis <= *piVar1)) {
        uVar5 = (ulong)((int)uVar5 + 1);
      }
      lVar4 = lVar4 + 1;
    } while (lVar8 != lVar4);
  }
  printf("Supp: %3d=%3d+%3d+%3d  ",(ulong)uVar9,uVar6,uVar5,
         (ulong)((uVar9 - (int)uVar6) - (int)uVar5));
  vMinCut = Llb_ManCutRange(p,vLower,vUpper);
  uVar2 = vMinCut->nSize;
  if (0 < (long)(int)uVar2) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      if (((*(uint *)((long)vMinCut->pArray[lVar8] + 0x18) & 7) == 2) &&
         (*vMinCut->pArray[lVar8] < p->nTruePis)) {
        uVar7 = uVar7 + 1;
      }
      lVar8 = lVar8 + 1;
    } while ((int)uVar2 != lVar8);
  }
  uVar3 = Llb_ManCutLiNum(p,vMinCut);
  printf("Range: %3d=%3d+%3d+%3d  ",(ulong)uVar2,(ulong)uVar7,(ulong)uVar3,
         (ulong)((uVar2 - uVar7) - uVar3));
  uVar7 = Llb_ManCutVolume(p,vLower,vUpper);
  printf("S =%3d. V =%3d.\n",(ulong)(uVar9 + uVar2),(ulong)uVar7);
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  if (vMinCut->pArray != (void **)0x0) {
    free(vMinCut->pArray);
  }
  free(vMinCut);
  return;
}

Assistant:

void Llb_ManCutPrint( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper )
{
    Vec_Ptr_t * vSupp, * vRange;
    int Pis, Ffs, And;

    Pis = Llb_ManCutPiNum(p, vLower);
    Ffs = Llb_ManCutLoNum(p, vLower);
    And = Vec_PtrSize(vLower) - Pis - Ffs;
    printf( "Leaf: %3d=%3d+%3d+%3d  ",  Vec_PtrSize(vLower), Pis, Ffs, And );

    Pis = Llb_ManCutPiNum(p, vUpper);
    Ffs = Llb_ManCutLiNum(p, vUpper);
    And = Vec_PtrSize(vUpper) - Pis - Ffs;
    printf( "Root: %3d=%3d+%3d+%3d  ", Vec_PtrSize(vUpper), Pis, Ffs, And );

    vSupp = Llb_ManCutSupp( p, vLower, vUpper );
    Pis = Llb_ManCutPiNum(p, vSupp);
    Ffs = Llb_ManCutLoNum(p, vSupp);
    And = Vec_PtrSize(vSupp) - Pis - Ffs;
    printf( "Supp: %3d=%3d+%3d+%3d  ", Vec_PtrSize(vSupp), Pis, Ffs, And );

    vRange = Llb_ManCutRange( p, vLower, vUpper );
    Pis = Llb_ManCutPiNum(p, vRange);
    Ffs = Llb_ManCutLiNum(p, vRange);
    And = Vec_PtrSize(vRange) - Pis - Ffs;
    printf( "Range: %3d=%3d+%3d+%3d  ", Vec_PtrSize(vRange), Pis, Ffs, And );

    printf( "S =%3d. V =%3d.\n", 
        Vec_PtrSize(vSupp)+Vec_PtrSize(vRange), Llb_ManCutVolume(p, vLower, vUpper) );
    Vec_PtrFree( vSupp );
    Vec_PtrFree( vRange );
/*   
    {
        Aig_Obj_t * pObj;
        int i;
        printf( "Lower: " );
        Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
            printf( " %d", pObj->Id );
        printf( "     " );
        printf( "Upper: " );
        Vec_PtrForEachEntry( Aig_Obj_t *, vUpper, pObj, i )
            printf( " %d", pObj->Id );
        printf( "\n" );
    }
*/
}